

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O0

Amap_Cut_t * Amap_ManSetupPis(Amap_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Amap_Cut_t *pAVar3;
  ulong *puVar4;
  uint *puVar5;
  char *pBuffer;
  int nBytes;
  int i;
  Amap_Cut_t *pCut;
  Amap_Obj_t *pObj;
  Amap_Man_t *p_local;
  
  iVar1 = Amap_ManPiNum(p);
  pAVar3 = (Amap_Cut_t *)malloc((long)(iVar1 * 8));
  for (pBuffer._4_4_ = 0; iVar1 = Vec_PtrSize(p->vPis), pBuffer._4_4_ < iVar1;
      pBuffer._4_4_ = pBuffer._4_4_ + 1) {
    puVar4 = (ulong *)Vec_PtrEntry(p->vPis,pBuffer._4_4_);
    puVar5 = (uint *)((long)&pAVar3->field_0x0 + (long)(pBuffer._4_4_ * 8));
    *puVar5 = *puVar5 & 0xffff0000;
    *puVar5 = *puVar5 & 0xfffeffff;
    *puVar5 = *puVar5 & 0x1ffff | 0x20000;
    uVar2 = Abc_Var2Lit((uint)(*puVar4 >> 3) & 0x1fffffff,0);
    puVar5[1] = uVar2;
    puVar4[4] = (ulong)puVar5;
    *(uint *)(puVar4 + 1) = (uint)puVar4[1] & 0xfff | 0x1000;
    *(undefined4 *)(puVar4 + 5) = 0x3f800000;
  }
  return pAVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates new cut and adds it to storage.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Amap_Cut_t * Amap_ManSetupPis( Amap_Man_t * p )
{
    Amap_Obj_t * pObj;
    Amap_Cut_t * pCut;
    int i, nBytes = sizeof(Amap_Cut_t) + sizeof(int);
    char * pBuffer = ABC_ALLOC( char, Amap_ManPiNum(p) * nBytes );
    Amap_ManForEachPi( p, pObj, i )
    {
        pCut = (Amap_Cut_t *)( pBuffer + i*nBytes );
        pCut->iMat = 0;
        pCut->fInv = 0;
        pCut->nFans = 1;
        pCut->Fans[0] = Abc_Var2Lit( pObj->Id, 0 );
        pObj->pData = pCut;
        pObj->nCuts = 1;
        pObj->EstRefs = (float)1.0;
    }
    return (Amap_Cut_t *)pBuffer;
}